

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>
          (Data *this,uint16 op,ByteCodeWriter *writer)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined1 local_26;
  undefined1 local_25;
  uint local_24;
  byte byteop_1;
  byte byteop;
  ByteCodeWriter *pBStack_20;
  uint offset;
  ByteCodeWriter *writer_local;
  Data *pDStack_10;
  uint16 op_local;
  Data *this_local;
  
  local_24 = this->currentOffset;
  pBStack_20 = writer;
  writer_local._6_2_ = op;
  pDStack_10 = this;
  if (op < 0x100) {
    local_25 = (undefined1)op;
    Write(this,&local_25,1);
  }
  else {
    local_26 = 1;
    Write(this,&local_26,1);
    Write(this,(void *)((long)&writer_local + 6),2);
  }
  uVar3 = OpCodeUtil::EncodedSize(writer_local._6_2_,SmallLayout);
  if (uVar3 != this->currentOffset - local_24) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd2e,
                                "(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset))"
                                ,
                                "OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout) == (currentOffset - offset)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Data::EncodeOpCode<SmallLayout>(
        uint16 op,
        ByteCodeWriter* writer)
    {
        DebugOnly(const uint offset = currentOffset);
        if (op <= (uint16)Js::OpCode::MaxByteSizedOpcodes)
        {
            byte byteop = (byte)op;
            Write(&byteop, sizeof(byte));
        }
        else
        {
            byte byteop = (byte)Js::OpCode::ExtendedOpcodePrefix;
            Write(&byteop, sizeof(byte));
            Write(&op, sizeof(uint16));
        }
        Assert(OpCodeUtil::EncodedSize((Js::OpCode)op, SmallLayout)
               == (currentOffset - offset));
    }